

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::ArgumentMismatch::~ArgumentMismatch(ArgumentMismatch *this)

{
  ArgumentMismatch *this_local;
  
  ~ArgumentMismatch(this);
  operator_delete(this);
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, std::size_t received)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(received))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(received)),
                           ExitCodes::ArgumentMismatch) {}